

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

void pop3_get_message(char *buffer,char **outptr)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  
  sVar1 = strlen(buffer);
  if (sVar1 < 3) {
    pcVar3 = buffer + sVar1;
  }
  else {
    lVar4 = 3 - sVar1;
    for (pcVar3 = buffer + 2; (*pcVar3 == '\t' || (*pcVar3 == ' ')); pcVar3 = pcVar3 + 1) {
      lVar4 = lVar4 + 1;
    }
    if (lVar4 != 1) {
      lVar2 = 0;
      do {
        if ((0x20 < (ulong)(byte)buffer[lVar2 + (sVar1 - 1)]) ||
           ((0x100002600U >> ((ulong)(byte)buffer[lVar2 + (sVar1 - 1)] & 0x3f) & 1) == 0)) {
          buffer[lVar2 + sVar1] = '\0';
          break;
        }
        bVar5 = lVar4 != lVar2;
        lVar2 = lVar2 + -1;
      } while (bVar5);
    }
  }
  *outptr = pcVar3;
  return;
}

Assistant:

static void pop3_get_message(char *buffer, char **outptr)
{
  size_t len = strlen(buffer);
  char *message = NULL;

  if(len > 2) {
    /* Find the start of the message */
    len -= 2;
    for(message = buffer + 2; *message == ' ' || *message == '\t';
        message++, len--)
      ;

    /* Find the end of the message */
    for(; len--;)
      if(message[len] != '\r' && message[len] != '\n' && message[len] != ' ' &&
         message[len] != '\t')
        break;

    /* Terminate the message */
    if(++len) {
      message[len] = '\0';
    }
  }
  else
    /* junk input => zero length output */
    message = &buffer[len];

  *outptr = message;
}